

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

int stbi_write_jpg_core(stbi__write_context *s,int width,int height,int comp,void *data,int quality)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  undefined8 *in_RDI;
  long in_R8;
  int in_R9D;
  float fVar3;
  float fVar4;
  float fVar5;
  float b_1;
  float g_1;
  float r_1;
  int p_1;
  int base_p_1;
  int clamped_row_1;
  float V_1 [64];
  float U_1 [64];
  float Y_1 [64];
  int j;
  int xx;
  int yy;
  float subV [64];
  float subU [64];
  float b;
  float g;
  float r;
  int p;
  int base_p;
  int clamped_row;
  float V [256];
  float U [256];
  float Y [256];
  int pos;
  int y;
  int x;
  uchar *dataB;
  uchar *dataG;
  uchar *dataR;
  int ofsB;
  int ofsG;
  int bitCnt;
  int bitBuf;
  int DCV;
  int DCU;
  int DCY;
  uchar head1 [24];
  int yti;
  int uvti;
  uchar UVTable [64];
  uchar YTable [64];
  float fdtbl_UV [64];
  float fdtbl_Y [64];
  int subsample;
  int k;
  int i;
  int col;
  int row;
  uchar in_stack_ffffffffffffeb2f;
  unsigned_short (*in_stack_ffffffffffffeb30) [2];
  unsigned_short (*in_stack_ffffffffffffeb38) [2];
  int in_stack_ffffffffffffeb40;
  int in_stack_ffffffffffffeb44;
  int in_stack_ffffffffffffeb48;
  int in_stack_ffffffffffffeb4c;
  int in_stack_ffffffffffffeb50;
  int in_stack_ffffffffffffeb54;
  int local_14a8;
  int local_14a4;
  int local_14a0;
  byte local_149c;
  int local_1498;
  byte local_1494;
  int local_1490;
  int local_148c;
  int local_1488;
  int local_1484;
  float local_1468 [60];
  float *in_stack_ffffffffffffec88;
  int in_stack_ffffffffffffec94;
  float *in_stack_ffffffffffffec98;
  int *in_stack_ffffffffffffeca0;
  int *in_stack_ffffffffffffeca8;
  stbi__write_context *in_stack_ffffffffffffecb0;
  int in_stack_ffffffffffffecd0;
  unsigned_short (*in_stack_ffffffffffffecd8) [2];
  unsigned_short (*in_stack_ffffffffffffece0) [2];
  float local_1268 [65];
  int local_1164;
  int local_1160;
  int local_115c;
  float local_1158 [64];
  float local_1058 [66];
  float local_f50;
  float local_f4c;
  float local_f48;
  int local_f44;
  int local_f40;
  int local_f3c;
  float afStack_f38 [256];
  float afStack_b38 [256];
  float local_738 [259];
  int local_32c;
  int local_328;
  int local_324;
  long local_320;
  long local_318;
  long local_310;
  int local_304;
  uint local_300;
  undefined4 local_2fc;
  undefined4 local_2f8;
  int local_2f4;
  int local_2f0;
  int local_2ec;
  undefined1 local_2e8;
  undefined1 local_2e7;
  undefined1 local_2e6;
  undefined1 local_2e5;
  undefined1 local_2e4;
  undefined1 local_2e3;
  undefined1 local_2e2;
  undefined1 local_2e1;
  undefined1 local_2e0;
  undefined1 local_2df;
  undefined1 local_2de;
  undefined1 local_2dd;
  undefined1 local_2dc;
  undefined1 local_2db;
  undefined1 local_2da;
  undefined1 local_2d9;
  undefined1 local_2d8;
  undefined1 local_2d7;
  undefined1 local_2d6;
  undefined1 local_2d5;
  undefined1 local_2d4;
  undefined1 local_2d3;
  undefined1 local_2d2;
  undefined1 local_2d1;
  int local_2d0;
  int local_2cc;
  byte local_2c8 [64];
  byte local_288 [64];
  float local_248 [64];
  float local_148 [66];
  uint local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  long local_28;
  int local_1c;
  int local_18;
  int local_14;
  undefined8 *local_10;
  int local_4;
  
  if ((((in_R8 == 0) || (in_ESI == 0)) || (in_EDX == 0)) || ((4 < in_ECX || (in_ECX < 1)))) {
    local_4 = 0;
  }
  else {
    local_1484 = in_R9D;
    if (in_R9D == 0) {
      local_1484 = 0x5a;
    }
    local_40 = (uint)(local_1484 < 0x5b);
    if (local_1484 < 1) {
      local_1488 = 1;
    }
    else {
      if (local_1484 < 0x65) {
        local_148c = local_1484;
      }
      else {
        local_148c = 100;
      }
      local_1488 = local_148c;
    }
    if (local_1488 < 0x32) {
      local_1490 = (int)(5000 / (long)local_1488);
    }
    else {
      local_1490 = local_1488 * -2 + 200;
    }
    local_2c = local_1490;
    local_28 = in_R8;
    local_1c = in_ECX;
    local_18 = in_EDX;
    local_14 = in_ESI;
    local_10 = in_RDI;
    for (local_38 = 0; local_38 < 0x40; local_38 = local_38 + 1) {
      local_1498 = (stbi_write_jpg_core::YQT[local_38] * local_2c + 0x32) / 100;
      local_2d0 = local_1498;
      if (local_1498 < 1) {
        local_1494 = 1;
      }
      else {
        if (0xff < local_1498) {
          local_1498 = 0xff;
        }
        local_1494 = (byte)local_1498;
      }
      local_288[""[local_38]] = local_1494;
      local_14a0 = (stbi_write_jpg_core::UVQT[local_38] * local_2c + 0x32) / 100;
      local_2cc = local_14a0;
      if (local_14a0 < 1) {
        local_149c = 1;
      }
      else {
        if (0xff < local_14a0) {
          local_14a0 = 0xff;
        }
        local_149c = (byte)local_14a0;
      }
      local_2c8[""[local_38]] = local_149c;
    }
    local_3c = 0;
    for (local_30 = 0; local_30 < 8; local_30 = local_30 + 1) {
      for (local_34 = 0; local_34 < 8; local_34 = local_34 + 1) {
        local_148[local_3c] =
             1.0 / ((float)local_288[""[local_3c]] * stbi_write_jpg_core::aasf[local_30] *
                   stbi_write_jpg_core::aasf[local_34]);
        local_248[local_3c] =
             1.0 / ((float)local_2c8[""[local_3c]] * stbi_write_jpg_core::aasf[local_30] *
                   stbi_write_jpg_core::aasf[local_34]);
        local_3c = local_3c + 1;
      }
    }
    local_2e8 = 0xff;
    local_2e7 = 0xc0;
    local_2e6 = 0;
    local_2e5 = 0x11;
    local_2e4 = 8;
    local_2e3 = (undefined1)((uint)local_18 >> 8);
    local_2e2 = (undefined1)local_18;
    local_2e1 = (undefined1)((uint)local_14 >> 8);
    local_2e0 = (undefined1)local_14;
    local_2df = 3;
    local_2de = 1;
    local_2dd = 0x11;
    if (local_40 != 0) {
      local_2dd = 0x22;
    }
    local_2dc = 0;
    local_2db = 2;
    local_2da = 0x11;
    local_2d9 = 1;
    local_2d8 = 3;
    local_2d7 = 0x11;
    local_2d6 = 1;
    local_2d5 = 0xff;
    local_2d4 = 0xc4;
    local_2d3 = 1;
    local_2d2 = 0xa2;
    local_2d1 = 0;
    (*(code *)*local_10)(local_10[1],stbi_write_jpg_core::head0,0x19);
    (*(code *)*local_10)(local_10[1],local_288,0x40);
    stbiw__putc((stbi__write_context *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb2f);
    (*(code *)*local_10)(local_10[1],local_2c8,0x40);
    (*(code *)*local_10)(local_10[1],&local_2e8,0x18);
    (*(code *)*local_10)(local_10[1],"",0x10);
    (*(code *)*local_10)(local_10[1],"",0xc);
    stbiw__putc((stbi__write_context *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb2f);
    (*(code *)*local_10)(local_10[1],"",0x10);
    (*(code *)*local_10)(local_10[1],"\x01\x02\x03",0xa2);
    stbiw__putc((stbi__write_context *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb2f);
    (*(code *)*local_10)(local_10[1],"",0x10);
    (*(code *)*local_10)(local_10[1],"",0xc);
    stbiw__putc((stbi__write_context *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb2f);
    (*(code *)*local_10)(local_10[1],"",0x10);
    (*(code *)*local_10)(local_10[1],"",0xa2);
    (*(code *)*local_10)(local_10[1],stbi_write_jpg_core::head2,0xe);
    local_2ec = 0;
    local_2f0 = 0;
    local_2f4 = 0;
    local_2f8 = 0;
    local_2fc = 0;
    local_300 = (uint)(2 < local_1c);
    local_304 = 0;
    if (2 < local_1c) {
      local_304 = 2;
    }
    local_310 = local_28;
    local_318 = local_28 + (int)local_300;
    local_320 = local_28 + local_304;
    if (local_40 == 0) {
      for (local_328 = 0; local_328 < local_18; local_328 = local_328 + 8) {
        for (local_324 = 0; local_324 < local_14; local_324 = local_324 + 8) {
          local_32c = 0;
          for (local_30 = local_328; local_30 < local_328 + 8; local_30 = local_30 + 1) {
            in_stack_ffffffffffffeb4c = local_30;
            if (local_18 <= local_30) {
              in_stack_ffffffffffffeb4c = local_18 + -1;
            }
            in_stack_ffffffffffffeb48 = in_stack_ffffffffffffeb4c;
            if (stbi__flip_vertically_on_write != 0) {
              in_stack_ffffffffffffeb48 = (local_18 + -1) - in_stack_ffffffffffffeb4c;
            }
            iVar1 = in_stack_ffffffffffffeb48 * local_14 * local_1c;
            for (local_34 = local_324; local_34 < local_324 + 8; local_34 = local_34 + 1) {
              in_stack_ffffffffffffeb40 = local_34;
              if (local_14 <= local_34) {
                in_stack_ffffffffffffeb40 = local_14 + -1;
              }
              iVar2 = iVar1 + in_stack_ffffffffffffeb40 * local_1c;
              fVar3 = (float)*(byte *)(local_310 + iVar2);
              fVar4 = (float)*(byte *)(local_318 + iVar2);
              fVar5 = (float)*(byte *)(local_320 + iVar2);
              local_1268[local_32c] = (fVar5 * 0.114 + fVar3 * 0.299 + fVar4 * 0.587) - 128.0;
              *(float *)(&stack0xffffffffffffec98 + (long)local_32c * 4) =
                   fVar5 * 0.5 + fVar3 * -0.16874 + -(fVar4 * 0.33126);
              local_1468[local_32c] = fVar5 * -0.08131 + fVar3 * 0.5 + -(fVar4 * 0.41869);
              local_32c = local_32c + 1;
              in_stack_ffffffffffffeb44 = iVar1;
            }
          }
          local_2ec = stbiw__jpg_processDU
                                (in_stack_ffffffffffffecb0,in_stack_ffffffffffffeca8,
                                 in_stack_ffffffffffffeca0,in_stack_ffffffffffffec98,
                                 in_stack_ffffffffffffec94,in_stack_ffffffffffffec88,
                                 in_stack_ffffffffffffecd0,in_stack_ffffffffffffecd8,
                                 in_stack_ffffffffffffece0);
          local_2f0 = stbiw__jpg_processDU
                                (in_stack_ffffffffffffecb0,in_stack_ffffffffffffeca8,
                                 in_stack_ffffffffffffeca0,in_stack_ffffffffffffec98,
                                 in_stack_ffffffffffffec94,in_stack_ffffffffffffec88,
                                 in_stack_ffffffffffffecd0,in_stack_ffffffffffffecd8,
                                 in_stack_ffffffffffffece0);
          in_stack_ffffffffffffeb30 = stbi_write_jpg_core::UVDC_HT;
          in_stack_ffffffffffffeb38 = stbi_write_jpg_core::UVAC_HT;
          local_2f4 = stbiw__jpg_processDU
                                (in_stack_ffffffffffffecb0,in_stack_ffffffffffffeca8,
                                 in_stack_ffffffffffffeca0,in_stack_ffffffffffffec98,
                                 in_stack_ffffffffffffec94,in_stack_ffffffffffffec88,
                                 in_stack_ffffffffffffecd0,in_stack_ffffffffffffecd8,
                                 in_stack_ffffffffffffece0);
        }
      }
    }
    else {
      for (local_328 = 0; local_328 < local_18; local_328 = local_328 + 0x10) {
        for (local_324 = 0; local_324 < local_14; local_324 = local_324 + 0x10) {
          local_32c = 0;
          for (local_30 = local_328; local_30 < local_328 + 0x10; local_30 = local_30 + 1) {
            if (local_30 < local_18) {
              local_14a4 = local_30;
            }
            else {
              local_14a4 = local_18 + -1;
            }
            local_f3c = local_14a4;
            if (stbi__flip_vertically_on_write == 0) {
              local_14a8 = local_14a4;
            }
            else {
              local_14a8 = (local_18 + -1) - local_14a4;
            }
            local_f40 = local_14a8 * local_14 * local_1c;
            for (local_34 = local_324; local_34 < local_324 + 0x10; local_34 = local_34 + 1) {
              in_stack_ffffffffffffeb50 = local_34;
              if (local_14 <= local_34) {
                in_stack_ffffffffffffeb50 = local_14 + -1;
              }
              local_f44 = local_f40 + in_stack_ffffffffffffeb50 * local_1c;
              local_f48 = (float)*(byte *)(local_310 + local_f44);
              local_f4c = (float)*(byte *)(local_318 + local_f44);
              local_f50 = (float)*(byte *)(local_320 + local_f44);
              local_738[local_32c] =
                   (local_f50 * 0.114 + local_f48 * 0.299 + local_f4c * 0.587) - 128.0;
              afStack_b38[local_32c] =
                   local_f50 * 0.5 + local_f48 * -0.16874 + -(local_f4c * 0.33126);
              afStack_f38[local_32c] =
                   local_f50 * -0.08131 + local_f48 * 0.5 + -(local_f4c * 0.41869);
              local_32c = local_32c + 1;
              in_stack_ffffffffffffeb54 = local_f40;
            }
          }
          local_2ec = stbiw__jpg_processDU
                                (in_stack_ffffffffffffecb0,in_stack_ffffffffffffeca8,
                                 in_stack_ffffffffffffeca0,in_stack_ffffffffffffec98,
                                 in_stack_ffffffffffffec94,in_stack_ffffffffffffec88,
                                 in_stack_ffffffffffffecd0,in_stack_ffffffffffffecd8,
                                 in_stack_ffffffffffffece0);
          local_2ec = stbiw__jpg_processDU
                                (in_stack_ffffffffffffecb0,in_stack_ffffffffffffeca8,
                                 in_stack_ffffffffffffeca0,in_stack_ffffffffffffec98,
                                 in_stack_ffffffffffffec94,in_stack_ffffffffffffec88,
                                 in_stack_ffffffffffffecd0,in_stack_ffffffffffffecd8,
                                 in_stack_ffffffffffffece0);
          local_2ec = stbiw__jpg_processDU
                                (in_stack_ffffffffffffecb0,in_stack_ffffffffffffeca8,
                                 in_stack_ffffffffffffeca0,in_stack_ffffffffffffec98,
                                 in_stack_ffffffffffffec94,in_stack_ffffffffffffec88,
                                 in_stack_ffffffffffffecd0,in_stack_ffffffffffffecd8,
                                 in_stack_ffffffffffffece0);
          local_2ec = stbiw__jpg_processDU
                                (in_stack_ffffffffffffecb0,in_stack_ffffffffffffeca8,
                                 in_stack_ffffffffffffeca0,in_stack_ffffffffffffec98,
                                 in_stack_ffffffffffffec94,in_stack_ffffffffffffec88,
                                 in_stack_ffffffffffffecd0,in_stack_ffffffffffffecd8,
                                 in_stack_ffffffffffffece0);
          local_32c = 0;
          for (local_115c = 0; local_115c < 8; local_115c = local_115c + 1) {
            for (local_1160 = 0; local_1160 < 8; local_1160 = local_1160 + 1) {
              local_1164 = local_115c * 0x20 + local_1160 * 2;
              local_1058[local_32c] =
                   (afStack_b38[local_1164] + afStack_b38[local_1164 + 1] +
                    afStack_b38[local_1164 + 0x10] + afStack_b38[local_1164 + 0x11]) * 0.25;
              local_1158[local_32c] =
                   (afStack_f38[local_1164] + afStack_f38[local_1164 + 1] +
                    afStack_f38[local_1164 + 0x10] + afStack_f38[local_1164 + 0x11]) * 0.25;
              local_32c = local_32c + 1;
            }
          }
          local_2f0 = stbiw__jpg_processDU
                                (in_stack_ffffffffffffecb0,in_stack_ffffffffffffeca8,
                                 in_stack_ffffffffffffeca0,in_stack_ffffffffffffec98,
                                 in_stack_ffffffffffffec94,in_stack_ffffffffffffec88,
                                 in_stack_ffffffffffffecd0,in_stack_ffffffffffffecd8,
                                 in_stack_ffffffffffffece0);
          in_stack_ffffffffffffeb30 = stbi_write_jpg_core::UVDC_HT;
          in_stack_ffffffffffffeb38 = stbi_write_jpg_core::UVAC_HT;
          local_2f4 = stbiw__jpg_processDU
                                (in_stack_ffffffffffffecb0,in_stack_ffffffffffffeca8,
                                 in_stack_ffffffffffffeca0,in_stack_ffffffffffffec98,
                                 in_stack_ffffffffffffec94,in_stack_ffffffffffffec88,
                                 in_stack_ffffffffffffecd0,in_stack_ffffffffffffecd8,
                                 in_stack_ffffffffffffece0);
        }
      }
    }
    stbiw__jpg_writeBits
              ((stbi__write_context *)CONCAT44(in_stack_ffffffffffffeb54,in_stack_ffffffffffffeb50),
               (int *)CONCAT44(in_stack_ffffffffffffeb4c,in_stack_ffffffffffffeb48),
               (int *)CONCAT44(in_stack_ffffffffffffeb44,in_stack_ffffffffffffeb40),
               *in_stack_ffffffffffffeb38);
    stbiw__putc((stbi__write_context *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb2f);
    stbiw__putc((stbi__write_context *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb2f);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int stbi_write_jpg_core(stbi__write_context *s, int width, int height, int comp, const void* data, int quality) {
   // Constants that don't pollute global namespace
   static const unsigned char std_dc_luminance_nrcodes[] = {0,0,1,5,1,1,1,1,1,1,0,0,0,0,0,0,0};
   static const unsigned char std_dc_luminance_values[] = {0,1,2,3,4,5,6,7,8,9,10,11};
   static const unsigned char std_ac_luminance_nrcodes[] = {0,0,2,1,3,3,2,4,3,5,5,4,4,0,0,1,0x7d};
   static const unsigned char std_ac_luminance_values[] = {
      0x01,0x02,0x03,0x00,0x04,0x11,0x05,0x12,0x21,0x31,0x41,0x06,0x13,0x51,0x61,0x07,0x22,0x71,0x14,0x32,0x81,0x91,0xa1,0x08,
      0x23,0x42,0xb1,0xc1,0x15,0x52,0xd1,0xf0,0x24,0x33,0x62,0x72,0x82,0x09,0x0a,0x16,0x17,0x18,0x19,0x1a,0x25,0x26,0x27,0x28,
      0x29,0x2a,0x34,0x35,0x36,0x37,0x38,0x39,0x3a,0x43,0x44,0x45,0x46,0x47,0x48,0x49,0x4a,0x53,0x54,0x55,0x56,0x57,0x58,0x59,
      0x5a,0x63,0x64,0x65,0x66,0x67,0x68,0x69,0x6a,0x73,0x74,0x75,0x76,0x77,0x78,0x79,0x7a,0x83,0x84,0x85,0x86,0x87,0x88,0x89,
      0x8a,0x92,0x93,0x94,0x95,0x96,0x97,0x98,0x99,0x9a,0xa2,0xa3,0xa4,0xa5,0xa6,0xa7,0xa8,0xa9,0xaa,0xb2,0xb3,0xb4,0xb5,0xb6,
      0xb7,0xb8,0xb9,0xba,0xc2,0xc3,0xc4,0xc5,0xc6,0xc7,0xc8,0xc9,0xca,0xd2,0xd3,0xd4,0xd5,0xd6,0xd7,0xd8,0xd9,0xda,0xe1,0xe2,
      0xe3,0xe4,0xe5,0xe6,0xe7,0xe8,0xe9,0xea,0xf1,0xf2,0xf3,0xf4,0xf5,0xf6,0xf7,0xf8,0xf9,0xfa
   };
   static const unsigned char std_dc_chrominance_nrcodes[] = {0,0,3,1,1,1,1,1,1,1,1,1,0,0,0,0,0};
   static const unsigned char std_dc_chrominance_values[] = {0,1,2,3,4,5,6,7,8,9,10,11};
   static const unsigned char std_ac_chrominance_nrcodes[] = {0,0,2,1,2,4,4,3,4,7,5,4,4,0,1,2,0x77};
   static const unsigned char std_ac_chrominance_values[] = {
      0x00,0x01,0x02,0x03,0x11,0x04,0x05,0x21,0x31,0x06,0x12,0x41,0x51,0x07,0x61,0x71,0x13,0x22,0x32,0x81,0x08,0x14,0x42,0x91,
      0xa1,0xb1,0xc1,0x09,0x23,0x33,0x52,0xf0,0x15,0x62,0x72,0xd1,0x0a,0x16,0x24,0x34,0xe1,0x25,0xf1,0x17,0x18,0x19,0x1a,0x26,
      0x27,0x28,0x29,0x2a,0x35,0x36,0x37,0x38,0x39,0x3a,0x43,0x44,0x45,0x46,0x47,0x48,0x49,0x4a,0x53,0x54,0x55,0x56,0x57,0x58,
      0x59,0x5a,0x63,0x64,0x65,0x66,0x67,0x68,0x69,0x6a,0x73,0x74,0x75,0x76,0x77,0x78,0x79,0x7a,0x82,0x83,0x84,0x85,0x86,0x87,
      0x88,0x89,0x8a,0x92,0x93,0x94,0x95,0x96,0x97,0x98,0x99,0x9a,0xa2,0xa3,0xa4,0xa5,0xa6,0xa7,0xa8,0xa9,0xaa,0xb2,0xb3,0xb4,
      0xb5,0xb6,0xb7,0xb8,0xb9,0xba,0xc2,0xc3,0xc4,0xc5,0xc6,0xc7,0xc8,0xc9,0xca,0xd2,0xd3,0xd4,0xd5,0xd6,0xd7,0xd8,0xd9,0xda,
      0xe2,0xe3,0xe4,0xe5,0xe6,0xe7,0xe8,0xe9,0xea,0xf2,0xf3,0xf4,0xf5,0xf6,0xf7,0xf8,0xf9,0xfa
   };
   // Huffman tables
   static const unsigned short YDC_HT[256][2] = { {0,2},{2,3},{3,3},{4,3},{5,3},{6,3},{14,4},{30,5},{62,6},{126,7},{254,8},{510,9}};
   static const unsigned short UVDC_HT[256][2] = { {0,2},{1,2},{2,2},{6,3},{14,4},{30,5},{62,6},{126,7},{254,8},{510,9},{1022,10},{2046,11}};
   static const unsigned short YAC_HT[256][2] = {
      {10,4},{0,2},{1,2},{4,3},{11,4},{26,5},{120,7},{248,8},{1014,10},{65410,16},{65411,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {12,4},{27,5},{121,7},{502,9},{2038,11},{65412,16},{65413,16},{65414,16},{65415,16},{65416,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {28,5},{249,8},{1015,10},{4084,12},{65417,16},{65418,16},{65419,16},{65420,16},{65421,16},{65422,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {58,6},{503,9},{4085,12},{65423,16},{65424,16},{65425,16},{65426,16},{65427,16},{65428,16},{65429,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {59,6},{1016,10},{65430,16},{65431,16},{65432,16},{65433,16},{65434,16},{65435,16},{65436,16},{65437,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {122,7},{2039,11},{65438,16},{65439,16},{65440,16},{65441,16},{65442,16},{65443,16},{65444,16},{65445,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {123,7},{4086,12},{65446,16},{65447,16},{65448,16},{65449,16},{65450,16},{65451,16},{65452,16},{65453,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {250,8},{4087,12},{65454,16},{65455,16},{65456,16},{65457,16},{65458,16},{65459,16},{65460,16},{65461,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {504,9},{32704,15},{65462,16},{65463,16},{65464,16},{65465,16},{65466,16},{65467,16},{65468,16},{65469,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {505,9},{65470,16},{65471,16},{65472,16},{65473,16},{65474,16},{65475,16},{65476,16},{65477,16},{65478,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {506,9},{65479,16},{65480,16},{65481,16},{65482,16},{65483,16},{65484,16},{65485,16},{65486,16},{65487,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {1017,10},{65488,16},{65489,16},{65490,16},{65491,16},{65492,16},{65493,16},{65494,16},{65495,16},{65496,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {1018,10},{65497,16},{65498,16},{65499,16},{65500,16},{65501,16},{65502,16},{65503,16},{65504,16},{65505,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {2040,11},{65506,16},{65507,16},{65508,16},{65509,16},{65510,16},{65511,16},{65512,16},{65513,16},{65514,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {65515,16},{65516,16},{65517,16},{65518,16},{65519,16},{65520,16},{65521,16},{65522,16},{65523,16},{65524,16},{0,0},{0,0},{0,0},{0,0},{0,0},
      {2041,11},{65525,16},{65526,16},{65527,16},{65528,16},{65529,16},{65530,16},{65531,16},{65532,16},{65533,16},{65534,16},{0,0},{0,0},{0,0},{0,0},{0,0}
   };
   static const unsigned short UVAC_HT[256][2] = {
      {0,2},{1,2},{4,3},{10,4},{24,5},{25,5},{56,6},{120,7},{500,9},{1014,10},{4084,12},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {11,4},{57,6},{246,8},{501,9},{2038,11},{4085,12},{65416,16},{65417,16},{65418,16},{65419,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {26,5},{247,8},{1015,10},{4086,12},{32706,15},{65420,16},{65421,16},{65422,16},{65423,16},{65424,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {27,5},{248,8},{1016,10},{4087,12},{65425,16},{65426,16},{65427,16},{65428,16},{65429,16},{65430,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {58,6},{502,9},{65431,16},{65432,16},{65433,16},{65434,16},{65435,16},{65436,16},{65437,16},{65438,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {59,6},{1017,10},{65439,16},{65440,16},{65441,16},{65442,16},{65443,16},{65444,16},{65445,16},{65446,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {121,7},{2039,11},{65447,16},{65448,16},{65449,16},{65450,16},{65451,16},{65452,16},{65453,16},{65454,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {122,7},{2040,11},{65455,16},{65456,16},{65457,16},{65458,16},{65459,16},{65460,16},{65461,16},{65462,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {249,8},{65463,16},{65464,16},{65465,16},{65466,16},{65467,16},{65468,16},{65469,16},{65470,16},{65471,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {503,9},{65472,16},{65473,16},{65474,16},{65475,16},{65476,16},{65477,16},{65478,16},{65479,16},{65480,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {504,9},{65481,16},{65482,16},{65483,16},{65484,16},{65485,16},{65486,16},{65487,16},{65488,16},{65489,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {505,9},{65490,16},{65491,16},{65492,16},{65493,16},{65494,16},{65495,16},{65496,16},{65497,16},{65498,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {506,9},{65499,16},{65500,16},{65501,16},{65502,16},{65503,16},{65504,16},{65505,16},{65506,16},{65507,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {2041,11},{65508,16},{65509,16},{65510,16},{65511,16},{65512,16},{65513,16},{65514,16},{65515,16},{65516,16},{0,0},{0,0},{0,0},{0,0},{0,0},{0,0},
      {16352,14},{65517,16},{65518,16},{65519,16},{65520,16},{65521,16},{65522,16},{65523,16},{65524,16},{65525,16},{0,0},{0,0},{0,0},{0,0},{0,0},
      {1018,10},{32707,15},{65526,16},{65527,16},{65528,16},{65529,16},{65530,16},{65531,16},{65532,16},{65533,16},{65534,16},{0,0},{0,0},{0,0},{0,0},{0,0}
   };
   static const int YQT[] = {16,11,10,16,24,40,51,61,12,12,14,19,26,58,60,55,14,13,16,24,40,57,69,56,14,17,22,29,51,87,80,62,18,22,
                             37,56,68,109,103,77,24,35,55,64,81,104,113,92,49,64,78,87,103,121,120,101,72,92,95,98,112,100,103,99};
   static const int UVQT[] = {17,18,24,47,99,99,99,99,18,21,26,66,99,99,99,99,24,26,56,99,99,99,99,99,47,66,99,99,99,99,99,99,
                              99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99,99};
   static const float aasf[] = { 1.0f * 2.828427125f, 1.387039845f * 2.828427125f, 1.306562965f * 2.828427125f, 1.175875602f * 2.828427125f,
                                 1.0f * 2.828427125f, 0.785694958f * 2.828427125f, 0.541196100f * 2.828427125f, 0.275899379f * 2.828427125f };

   int row, col, i, k, subsample;
   float fdtbl_Y[64], fdtbl_UV[64];
   unsigned char YTable[64], UVTable[64];

   if(!data || !width || !height || comp > 4 || comp < 1) {
      return 0;
   }

   quality = quality ? quality : 90;
   subsample = quality <= 90 ? 1 : 0;
   quality = quality < 1 ? 1 : quality > 100 ? 100 : quality;
   quality = quality < 50 ? 5000 / quality : 200 - quality * 2;

   for(i = 0; i < 64; ++i) {
      int uvti, yti = (YQT[i]*quality+50)/100;
      YTable[stbiw__jpg_ZigZag[i]] = (unsigned char) (yti < 1 ? 1 : yti > 255 ? 255 : yti);
      uvti = (UVQT[i]*quality+50)/100;
      UVTable[stbiw__jpg_ZigZag[i]] = (unsigned char) (uvti < 1 ? 1 : uvti > 255 ? 255 : uvti);
   }

   for(row = 0, k = 0; row < 8; ++row) {
      for(col = 0; col < 8; ++col, ++k) {
         fdtbl_Y[k]  = 1 / (YTable [stbiw__jpg_ZigZag[k]] * aasf[row] * aasf[col]);
         fdtbl_UV[k] = 1 / (UVTable[stbiw__jpg_ZigZag[k]] * aasf[row] * aasf[col]);
      }
   }

   // Write Headers
   {
      static const unsigned char head0[] = { 0xFF,0xD8,0xFF,0xE0,0,0x10,'J','F','I','F',0,1,1,0,0,1,0,1,0,0,0xFF,0xDB,0,0x84,0 };
      static const unsigned char head2[] = { 0xFF,0xDA,0,0xC,3,1,0,2,0x11,3,0x11,0,0x3F,0 };
      const unsigned char head1[] = { 0xFF,0xC0,0,0x11,8,(unsigned char)(height>>8),STBIW_UCHAR(height),(unsigned char)(width>>8),STBIW_UCHAR(width),
                                      3,1,(unsigned char)(subsample?0x22:0x11),0,2,0x11,1,3,0x11,1,0xFF,0xC4,0x01,0xA2,0 };
      s->func(s->context, (void*)head0, sizeof(head0));
      s->func(s->context, (void*)YTable, sizeof(YTable));
      stbiw__putc(s, 1);
      s->func(s->context, UVTable, sizeof(UVTable));
      s->func(s->context, (void*)head1, sizeof(head1));
      s->func(s->context, (void*)(std_dc_luminance_nrcodes+1), sizeof(std_dc_luminance_nrcodes)-1);
      s->func(s->context, (void*)std_dc_luminance_values, sizeof(std_dc_luminance_values));
      stbiw__putc(s, 0x10); // HTYACinfo
      s->func(s->context, (void*)(std_ac_luminance_nrcodes+1), sizeof(std_ac_luminance_nrcodes)-1);
      s->func(s->context, (void*)std_ac_luminance_values, sizeof(std_ac_luminance_values));
      stbiw__putc(s, 1); // HTUDCinfo
      s->func(s->context, (void*)(std_dc_chrominance_nrcodes+1), sizeof(std_dc_chrominance_nrcodes)-1);
      s->func(s->context, (void*)std_dc_chrominance_values, sizeof(std_dc_chrominance_values));
      stbiw__putc(s, 0x11); // HTUACinfo
      s->func(s->context, (void*)(std_ac_chrominance_nrcodes+1), sizeof(std_ac_chrominance_nrcodes)-1);
      s->func(s->context, (void*)std_ac_chrominance_values, sizeof(std_ac_chrominance_values));
      s->func(s->context, (void*)head2, sizeof(head2));
   }

   // Encode 8x8 macroblocks
   {
      static const unsigned short fillBits[] = {0x7F, 7};
      int DCY=0, DCU=0, DCV=0;
      int bitBuf=0, bitCnt=0;
      // comp == 2 is grey+alpha (alpha is ignored)
      int ofsG = comp > 2 ? 1 : 0, ofsB = comp > 2 ? 2 : 0;
      const unsigned char *dataR = (const unsigned char *)data;
      const unsigned char *dataG = dataR + ofsG;
      const unsigned char *dataB = dataR + ofsB;
      int x, y, pos;
      if(subsample) {
         for(y = 0; y < height; y += 16) {
            for(x = 0; x < width; x += 16) {
               float Y[256], U[256], V[256];
               for(row = y, pos = 0; row < y+16; ++row) {
                  // row >= height => use last input row
                  int clamped_row = (row < height) ? row : height - 1;
                  int base_p = (stbi__flip_vertically_on_write ? (height-1-clamped_row) : clamped_row)*width*comp;
                  for(col = x; col < x+16; ++col, ++pos) {
                     // if col >= width => use pixel from last input column
                     int p = base_p + ((col < width) ? col : (width-1))*comp;
                     float r = dataR[p], g = dataG[p], b = dataB[p];
                     Y[pos]= +0.29900f*r + 0.58700f*g + 0.11400f*b - 128;
                     U[pos]= -0.16874f*r - 0.33126f*g + 0.50000f*b;
                     V[pos]= +0.50000f*r - 0.41869f*g - 0.08131f*b;
                  }
               }
               DCY = stbiw__jpg_processDU(s, &bitBuf, &bitCnt, Y+0,   16, fdtbl_Y, DCY, YDC_HT, YAC_HT);
               DCY = stbiw__jpg_processDU(s, &bitBuf, &bitCnt, Y+8,   16, fdtbl_Y, DCY, YDC_HT, YAC_HT);
               DCY = stbiw__jpg_processDU(s, &bitBuf, &bitCnt, Y+128, 16, fdtbl_Y, DCY, YDC_HT, YAC_HT);
               DCY = stbiw__jpg_processDU(s, &bitBuf, &bitCnt, Y+136, 16, fdtbl_Y, DCY, YDC_HT, YAC_HT);

               // subsample U,V
               {
                  float subU[64], subV[64];
                  int yy, xx;
                  for(yy = 0, pos = 0; yy < 8; ++yy) {
                     for(xx = 0; xx < 8; ++xx, ++pos) {
                        int j = yy*32+xx*2;
                        subU[pos] = (U[j+0] + U[j+1] + U[j+16] + U[j+17]) * 0.25f;
                        subV[pos] = (V[j+0] + V[j+1] + V[j+16] + V[j+17]) * 0.25f;
                     }
                  }
                  DCU = stbiw__jpg_processDU(s, &bitBuf, &bitCnt, subU, 8, fdtbl_UV, DCU, UVDC_HT, UVAC_HT);
                  DCV = stbiw__jpg_processDU(s, &bitBuf, &bitCnt, subV, 8, fdtbl_UV, DCV, UVDC_HT, UVAC_HT);
               }
            }
         }
      } else {
         for(y = 0; y < height; y += 8) {
            for(x = 0; x < width; x += 8) {
               float Y[64], U[64], V[64];
               for(row = y, pos = 0; row < y+8; ++row) {
                  // row >= height => use last input row
                  int clamped_row = (row < height) ? row : height - 1;
                  int base_p = (stbi__flip_vertically_on_write ? (height-1-clamped_row) : clamped_row)*width*comp;
                  for(col = x; col < x+8; ++col, ++pos) {
                     // if col >= width => use pixel from last input column
                     int p = base_p + ((col < width) ? col : (width-1))*comp;
                     float r = dataR[p], g = dataG[p], b = dataB[p];
                     Y[pos]= +0.29900f*r + 0.58700f*g + 0.11400f*b - 128;
                     U[pos]= -0.16874f*r - 0.33126f*g + 0.50000f*b;
                     V[pos]= +0.50000f*r - 0.41869f*g - 0.08131f*b;
                  }
               }

               DCY = stbiw__jpg_processDU(s, &bitBuf, &bitCnt, Y, 8, fdtbl_Y,  DCY, YDC_HT, YAC_HT);
               DCU = stbiw__jpg_processDU(s, &bitBuf, &bitCnt, U, 8, fdtbl_UV, DCU, UVDC_HT, UVAC_HT);
               DCV = stbiw__jpg_processDU(s, &bitBuf, &bitCnt, V, 8, fdtbl_UV, DCV, UVDC_HT, UVAC_HT);
            }
         }
      }

      // Do the bit alignment of the EOI marker
      stbiw__jpg_writeBits(s, &bitBuf, &bitCnt, fillBits);
   }

   // EOI
   stbiw__putc(s, 0xFF);
   stbiw__putc(s, 0xD9);

   return 1;
}